

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.cpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::apply
          (CRotationZ<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  RotationZ<std::complex<double>_> *pRVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_40_3_96b6a9c1 f;
  int *local_70 [2];
  long local_60;
  undefined1 local_58 [40];
  
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(local_70,this);
  *local_70[0] = *local_70[0] + offset;
  local_70[0][1] = local_70[0][1] + offset;
  iVar1 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar3 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  pRVar2 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_false>.
           _M_head_impl;
  local_58._8_8_ = (pRVar2->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_;
  local_58._32_8_ = (pRVar2->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.sin_;
  local_58._0_8_ =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (undefined4)local_58._32_8_;
  uVar5 = (uint)((ulong)local_58._32_8_ >> 0x20);
  uVar6 = uVar5 ^ 0x80000000;
  if (op == ConjTrans) {
    local_58._32_8_ = -(double)local_58._32_8_;
    uVar6 = uVar5;
  }
  local_58._20_4_ = uVar6;
  local_58._16_4_ = uVar4;
  local_58._24_8_ = local_58._8_8_;
  apply4<qclab::qgates::lambda_RotationZ<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_70[0],local_70[0][1],iVar1 + offset,iVar3 + offset,
             (this->super_QControlledGate2<std::complex<double>_>).controlState_,
             (anon_class_40_3_96b6a9c1 *)local_58);
  if (local_70[0] != (int *)0x0) {
    operator_delete(local_70[0],local_60 - (long)local_70[0]);
  }
  return;
}

Assistant:

void CRotationZ< T >::apply( Op op , const int nbQubits ,
                               std::vector< T >& vector ,
                               const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_RotationZ( op , this->cos() , this->sin() , vector.data() );
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }